

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_iceguy.cpp
# Opt level: O0

int AF_A_IceGuyChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  DAngle length;
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool local_96;
  bool local_93;
  TAngle<double> local_90;
  DVector3 local_88;
  FName local_6c;
  TAngle<double> local_68;
  AActor *local_60;
  AActor *mo;
  DAngle an;
  double dist;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                  ,0x34,"int AF_A_IceGuyChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    self_00 = (AActor *)(param->field_0).field_1.a;
    local_93 = true;
    if (self_00 != (AActor *)0x0) {
      local_93 = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_93 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                    ,0x34,"int AF_A_IceGuyChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
        bVar3 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                      ,0x34,"int AF_A_IceGuyChase(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_96 = true;
      if (this != (DObject *)0x0) {
        local_96 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_96 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                      ,0x34,"int AF_A_IceGuyChase(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, param[2].field_0.field_1.atag != 8)) {
        bVar3 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                      ,0x34,"int AF_A_IceGuyChase(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    TAngle<double>::TAngle((TAngle<double> *)&mo);
    A_Chase(stack,self_00);
    iVar1 = FRandom::operator()(&pr_iceguychase);
    if (iVar1 < 0x80) {
      iVar1 = FRandom::operator()(&pr_iceguychase);
      an.Degrees = ((double)(iVar1 + -0x80) * self_00->radius) / 128.0;
      TAngle<double>::operator+(&local_68,90.0);
      TAngle<double>::operator=((TAngle<double> *)&mo,&local_68);
      uVar2 = FRandom::operator()(&pr_iceguylook);
      FName::FName(&local_6c,WispTypes[(int)(uVar2 & 1)]);
      length = an;
      TAngle<double>::TAngle(&local_90,(TAngle<double> *)&mo);
      AActor::Vec3Angle(&local_88,self_00,length.Degrees,&local_90,60.0,false);
      local_60 = Spawn(&local_6c,&local_88,ALLOW_REPLACE);
      if (local_60 != (AActor *)0x0) {
        TVector3<double>::operator=(&local_60->Vel,&self_00->Vel);
        TObjPtr<AActor>::operator=(&local_60->target,self_00);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                ,0x34,"int AF_A_IceGuyChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceGuyChase)
{
	PARAM_ACTION_PROLOGUE;

	double dist;
	DAngle an;
	AActor *mo;

	A_Chase(stack, self);
	if (pr_iceguychase() < 128)
	{
		dist = (pr_iceguychase() - 128) * self->radius / 128.;
		an = self->Angles.Yaw + 90;
		mo = Spawn(WispTypes[pr_iceguylook() & 1], self->Vec3Angle(dist, an, 60.), ALLOW_REPLACE);
		if (mo)
		{
			mo->Vel = self->Vel;
			mo->target = self;
		}
	}
	return 0;
}